

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O2

DescriptorNode * __thiscall
cfd::core::DescriptorNode::operator=(DescriptorNode *this,DescriptorNode *object)

{
  uint32_t uVar1;
  DescriptorNodeType DVar2;
  DescriptorScriptType DVar3;
  
  if (this != object) {
    ::std::__cxx11::string::_M_assign((string *)this);
    ::std::__cxx11::string::_M_assign((string *)&this->value_);
    ::std::__cxx11::string::_M_assign((string *)&this->key_info_);
    this->is_uncompressed_key_ = object->is_uncompressed_key_;
    ::std::__cxx11::string::_M_assign((string *)&this->base_extkey_);
    ::std::__cxx11::string::_M_assign((string *)&this->tweak_sum_);
    this->number_ = object->number_;
    ::std::vector<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>::operator=
              (&this->child_node_,&object->child_node_);
    ::std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::DescriptorNode>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::DescriptorNode>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::DescriptorNode>_>_>
    ::operator=(&(this->tree_node_)._M_t,&(object->tree_node_)._M_t);
    ::std::__cxx11::string::_M_assign((string *)&this->checksum_);
    uVar1 = object->need_arg_num_;
    DVar2 = object->node_type_;
    DVar3 = object->script_type_;
    this->depth_ = object->depth_;
    this->need_arg_num_ = uVar1;
    this->node_type_ = DVar2;
    this->script_type_ = DVar3;
    this->key_type_ = object->key_type_;
    ::std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
    operator=(&this->addr_prefixes_,&object->addr_prefixes_);
    ::std::__cxx11::string::_M_assign((string *)&this->parent_kind_);
  }
  return this;
}

Assistant:

DescriptorNode& DescriptorNode::operator=(const DescriptorNode& object) {
  if (this != &object) {
    name_ = object.name_;
    value_ = object.value_;
    key_info_ = object.key_info_;
    is_uncompressed_key_ = object.is_uncompressed_key_;
    base_extkey_ = object.base_extkey_;
    tweak_sum_ = object.tweak_sum_;
    number_ = object.number_;
    child_node_ = object.child_node_;
    tree_node_ = object.tree_node_;
    checksum_ = object.checksum_;
    depth_ = object.depth_;
    need_arg_num_ = object.need_arg_num_;
    node_type_ = object.node_type_;
    script_type_ = object.script_type_;
    key_type_ = object.key_type_;
    addr_prefixes_ = object.addr_prefixes_;
    parent_kind_ = object.parent_kind_;
  }
  return *this;
}